

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_Straight_Open_TestShell::
TEST_DoublingFactorCounterTest_Straight_Open_TestShell
          (TEST_DoublingFactorCounterTest_Straight_Open_TestShell *this)

{
  TEST_DoublingFactorCounterTest_Straight_Open_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_DoublingFactorCounterTest_Straight_Open_TestShell_00253c10;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, Straight_Open)
{
	addPair(Tile::WestWind);
	addSequence(Tile::OneOfCharacters, true);
	addSequence(Tile::FourOfCharacters, false);
	addSequence(Tile::SevenOfCharacters, false);
	addTriplet(Tile::OneOfBamboos, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::Straight));
	CHECK_EQUAL(1, r.doubling_factor);
}